

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O2

bool __thiscall cmCTestSVN::NoteNewRevision(cmCTestSVN *this)

{
  string *p1;
  cmCTest *this_00;
  SVNInfo *svninfo;
  _List_node_base *this_01;
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  _List_node_base *p_Var4;
  string local_1c8;
  ostringstream cmCTestLog_msg;
  
  bVar1 = LoadRepositories(this);
  if (bVar1) {
    p_Var4 = (_List_node_base *)&this->Repositories;
    while (p_Var4 = (((_List_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_> *)
                     &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var4 != (_List_node_base *)&this->Repositories) {
      svninfo = (SVNInfo *)(p_Var4 + 1);
      LoadInfo_abi_cxx11_((string *)&cmCTestLog_msg,this,svninfo);
      this_01 = p_Var4 + 0xb;
      std::__cxx11::string::operator=((string *)this_01,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      poVar3 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                               "Revision for repository \'");
      poVar3 = std::operator<<(poVar3,(string *)svninfo);
      poVar3 = std::operator<<(poVar3,"\' after update: ");
      poVar3 = std::operator<<(poVar3,(string *)this_01);
      std::operator<<(poVar3,"\n");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,
                               "   New revision of external repository \'");
      poVar3 = std::operator<<(poVar3,(string *)svninfo);
      poVar3 = std::operator<<(poVar3,"\' is: ");
      poVar3 = std::operator<<(poVar3,(string *)this_01);
      std::operator<<(poVar3,"\n");
      this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(this_00,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestSVN.cxx"
                   ,0x85,local_1c8._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"Repository \'");
      poVar3 = std::operator<<(poVar3,(string *)svninfo);
      poVar3 = std::operator<<(poVar3,"\' URL = ");
      p1 = (string *)(p_Var4 + 3);
      poVar3 = std::operator<<(poVar3,(string *)p1);
      std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"Repository \'");
      poVar3 = std::operator<<(poVar3,(string *)svninfo);
      poVar3 = std::operator<<(poVar3,"\' Root = ");
      poVar3 = std::operator<<(poVar3,(string *)(p_Var4 + 5));
      std::operator<<(poVar3,"\n");
      if (p_Var4[5]._M_prev != (_List_node_base *)0x0) {
        bVar2 = cmCTestSVNPathStarts(p1,(string *)(p_Var4 + 5));
        if (bVar2) {
          std::__cxx11::string::substr((ulong)&local_1c8,(ulong)p1);
          cmCTest::DecodeURL((string *)&cmCTestLog_msg,&local_1c8);
          std::__cxx11::string::operator=((string *)(p_Var4 + 7),(string *)&cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::append((char *)(p_Var4 + 7));
        }
      }
      poVar3 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"Repository \'");
      poVar3 = std::operator<<(poVar3,(string *)svninfo);
      poVar3 = std::operator<<(poVar3,"\' Base = ");
      poVar3 = std::operator<<(poVar3,(string *)(p_Var4 + 7));
      std::operator<<(poVar3,"\n");
    }
    std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).NewRevision);
  }
  return bVar1;
}

Assistant:

bool cmCTestSVN::NoteNewRevision()
{
  if (!this->LoadRepositories()) {
    return false;
  }

  for (SVNInfo& svninfo : this->Repositories) {
    svninfo.NewRevision = this->LoadInfo(svninfo);
    this->Log << "Revision for repository '" << svninfo.LocalPath
              << "' after update: " << svninfo.NewRevision << "\n";
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               "   New revision of external repository '"
                 << svninfo.LocalPath << "' is: " << svninfo.NewRevision
                 << "\n");

    // svninfo.Root = ""; // uncomment to test GuessBase
    this->Log << "Repository '" << svninfo.LocalPath
              << "' URL = " << svninfo.URL << "\n";
    this->Log << "Repository '" << svninfo.LocalPath
              << "' Root = " << svninfo.Root << "\n";

    // Compute the base path the working tree has checked out under
    // the repository root.
    if (!svninfo.Root.empty() &&
        cmCTestSVNPathStarts(svninfo.URL, svninfo.Root)) {
      svninfo.Base =
        cmCTest::DecodeURL(svninfo.URL.substr(svninfo.Root.size()));
      svninfo.Base += "/";
    }
    this->Log << "Repository '" << svninfo.LocalPath
              << "' Base = " << svninfo.Base << "\n";
  }

  // Set the global new revision to the one of the root
  this->NewRevision = this->RootInfo->NewRevision;
  return true;
}